

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int nodeAcquire(Rtree *pRtree,i64 iNode,RtreeNode *pParent,RtreeNode **ppNode)

{
  sqlite3_blob **ppBlob;
  sqlite3_blob *psVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  Incrblob *p;
  RtreeNode *p_00;
  sqlite3_blob *pBlob;
  
  iVar3 = (int)((iNode & 0xffffffffU) * 0x51d07eaf >> 0x20);
  for (p_00 = pRtree->aHash[(int)iNode + (((uint)((int)iNode - iVar3) >> 1) + iVar3 >> 6) * -0x61];
      (p_00 != (RtreeNode *)0x0 && (p_00->iNode != iNode)); p_00 = p_00->pNext) {
  }
  if (p_00 == (RtreeNode *)0x0) {
    ppBlob = &pRtree->pNodeBlob;
    psVar1 = pRtree->pNodeBlob;
    if (psVar1 == (sqlite3_blob *)0x0) {
      iVar3 = 0;
    }
    else {
      *ppBlob = (sqlite3_blob *)0x0;
      iVar3 = sqlite3_blob_reopen(psVar1,iNode);
      *ppBlob = psVar1;
      if (iVar3 != 0) {
        *ppBlob = (sqlite3_blob *)0x0;
        sqlite3_blob_close(psVar1);
        if (iVar3 == 7) {
          return 7;
        }
      }
    }
    if (*ppBlob == (sqlite3_blob *)0x0) {
      iVar3 = sqlite3_blob_open(pRtree->db,pRtree->zDb,pRtree->zNodeName,"data",iNode,0,ppBlob);
    }
    if (iVar3 == 0) {
      iVar3 = pRtree->iNodeSize;
      psVar1 = pRtree->pNodeBlob;
      iVar4 = 0;
      if ((psVar1 != (sqlite3_blob *)0x0) && (*(long *)(psVar1 + 0x18) != 0)) {
        iVar4 = *(int *)psVar1;
      }
      iVar6 = 0;
      if (iVar3 != iVar4) goto LAB_001fa928;
      iVar4 = sqlite3_initialize();
      if (iVar4 == 0) {
        p_00 = (RtreeNode *)sqlite3Malloc((long)iVar3 + 0x28);
      }
      else {
        p_00 = (RtreeNode *)0x0;
      }
      if (p_00 == (RtreeNode *)0x0) {
        iVar6 = 7;
        p_00 = (RtreeNode *)0x0;
      }
      else {
        p_00->pParent = pParent;
        p_00->zData = (u8 *)(p_00 + 1);
        p_00->nRef = 1;
        pRtree->nNodeRef = pRtree->nNodeRef + 1;
        p_00->iNode = iNode;
        p_00->isDirty = 0;
        p_00->pNext = (RtreeNode *)0x0;
        iVar6 = blobReadWrite(pRtree->pNodeBlob,p_00 + 1,pRtree->iNodeSize,0,
                              sqlite3BtreePayloadChecked);
      }
    }
    else {
      *ppNode = (RtreeNode *)0x0;
      iVar6 = 0x10b;
      if (iVar3 != 1) {
        iVar6 = iVar3;
      }
LAB_001fa928:
      p_00 = (RtreeNode *)0x0;
    }
    if (((iNode == 1) && (iVar6 == 0)) && (p_00 != (RtreeNode *)0x0)) {
      uVar2 = *(ushort *)p_00->zData << 8 | *(ushort *)p_00->zData >> 8;
      pRtree->iDepth = (uint)uVar2;
      iVar6 = 0x10b;
      if (uVar2 < 0x29) {
        iVar6 = 0;
      }
    }
    if (((p_00 != (RtreeNode *)0x0) && (iVar6 == 0)) &&
       (iVar6 = 0x10b,
       (int)(uint)(ushort)(*(ushort *)(p_00->zData + 2) << 8 | *(ushort *)(p_00->zData + 2) >> 8) <=
       (pRtree->iNodeSize + -4) / (int)(uint)pRtree->nBytesPerCell)) {
      iVar6 = 0;
    }
    if (iVar6 != 0) {
      psVar1 = *ppBlob;
      *ppBlob = (sqlite3_blob *)0x0;
      sqlite3_blob_close(psVar1);
      if (p_00 != (RtreeNode *)0x0) {
        pRtree->nNodeRef = pRtree->nNodeRef - 1;
        sqlite3_free(p_00);
      }
      p_00 = (RtreeNode *)0x0;
      goto LAB_001fa9bb;
    }
    if (p_00 == (RtreeNode *)0x0) {
      iVar6 = 0x10b;
      goto LAB_001fa9bb;
    }
    if (pParent != (RtreeNode *)0x0) {
      pParent->nRef = pParent->nRef + 1;
    }
    uVar5 = (uint)p_00->iNode % 0x61;
    p_00->pNext = pRtree->aHash[uVar5];
    pRtree->aHash[uVar5] = p_00;
  }
  else {
    if ((pParent != (RtreeNode *)0x0) && (p_00->pParent != pParent)) {
      return 0x10b;
    }
    p_00->nRef = p_00->nRef + 1;
  }
  iVar6 = 0;
LAB_001fa9bb:
  *ppNode = p_00;
  return iVar6;
}

Assistant:

static int nodeAcquire(
  Rtree *pRtree,             /* R-tree structure */
  i64 iNode,                 /* Node number to load */
  RtreeNode *pParent,        /* Either the parent node or NULL */
  RtreeNode **ppNode         /* OUT: Acquired node */
){
  int rc = SQLITE_OK;
  RtreeNode *pNode = 0;

  /* Check if the requested node is already in the hash table. If so,
  ** increase its reference count and return it.
  */
  if( (pNode = nodeHashLookup(pRtree, iNode))!=0 ){
    if( pParent && ALWAYS(pParent!=pNode->pParent) ){
      RTREE_IS_CORRUPT(pRtree);
      return SQLITE_CORRUPT_VTAB;
    }
    pNode->nRef++;
    *ppNode = pNode;
    return SQLITE_OK;
  }

  if( pRtree->pNodeBlob ){
    sqlite3_blob *pBlob = pRtree->pNodeBlob;
    pRtree->pNodeBlob = 0;
    rc = sqlite3_blob_reopen(pBlob, iNode);
    pRtree->pNodeBlob = pBlob;
    if( rc ){
      nodeBlobReset(pRtree);
      if( rc==SQLITE_NOMEM ) return SQLITE_NOMEM;
    }
  }
  if( pRtree->pNodeBlob==0 ){
    rc = sqlite3_blob_open(pRtree->db, pRtree->zDb, pRtree->zNodeName,
                           "data", iNode, 0,
                           &pRtree->pNodeBlob);
  }
  if( rc ){
    *ppNode = 0;
    /* If unable to open an sqlite3_blob on the desired row, that can only
    ** be because the shadow tables hold erroneous data. */
    if( rc==SQLITE_ERROR ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }else if( pRtree->iNodeSize==sqlite3_blob_bytes(pRtree->pNodeBlob) ){
    pNode = (RtreeNode *)sqlite3_malloc64(sizeof(RtreeNode)+pRtree->iNodeSize);
    if( !pNode ){
      rc = SQLITE_NOMEM;
    }else{
      pNode->pParent = pParent;
      pNode->zData = (u8 *)&pNode[1];
      pNode->nRef = 1;
      pRtree->nNodeRef++;
      pNode->iNode = iNode;
      pNode->isDirty = 0;
      pNode->pNext = 0;
      rc = sqlite3_blob_read(pRtree->pNodeBlob, pNode->zData,
                             pRtree->iNodeSize, 0);
    }
  }

  /* If the root node was just loaded, set pRtree->iDepth to the height
  ** of the r-tree structure. A height of zero means all data is stored on
  ** the root node. A height of one means the children of the root node
  ** are the leaves, and so on. If the depth as specified on the root node
  ** is greater than RTREE_MAX_DEPTH, the r-tree structure must be corrupt.
  */
  if( rc==SQLITE_OK && pNode && iNode==1 ){
    pRtree->iDepth = readInt16(pNode->zData);
    if( pRtree->iDepth>RTREE_MAX_DEPTH ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  /* If no error has occurred so far, check if the "number of entries"
  ** field on the node is too large. If so, set the return code to
  ** SQLITE_CORRUPT_VTAB.
  */
  if( pNode && rc==SQLITE_OK ){
    if( NCELL(pNode)>((pRtree->iNodeSize-4)/pRtree->nBytesPerCell) ){
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
  }

  if( rc==SQLITE_OK ){
    if( pNode!=0 ){
      nodeReference(pParent);
      nodeHashInsert(pRtree, pNode);
    }else{
      rc = SQLITE_CORRUPT_VTAB;
      RTREE_IS_CORRUPT(pRtree);
    }
    *ppNode = pNode;
  }else{
    nodeBlobReset(pRtree);
    if( pNode ){
      pRtree->nNodeRef--;
      sqlite3_free(pNode);
    }
    *ppNode = 0;
  }

  return rc;
}